

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c++
# Opt level: O0

uint kj::anon_unknown_55::parseInteger<unsigned_int>(StringPtr *s)

{
  uint uVar1;
  unsigned_long_long uVar2;
  unsigned_long_long max;
  StringPtr *s_local;
  
  uVar1 = MaxValue_::operator_cast_to_unsigned_int((MaxValue_ *)&maxValue);
  uVar2 = parseUnsigned(s,(ulong)uVar1);
  return (uint)uVar2;
}

Assistant:

T parseInteger(const StringPtr& s) {
  if (static_cast<T>(minValue) < 0) {
    long long min = static_cast<T>(minValue);
    long long max = static_cast<T>(maxValue);
    return static_cast<T>(parseSigned(s, min, max));
  } else {
    unsigned long long max = static_cast<T>(maxValue);
    return static_cast<T>(parseUnsigned(s, max));
  }
}